

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall
pbrt::BinaryReader::read<pbrt::math::vec3i,std::allocator<pbrt::math::vec3i>,void>
          (BinaryReader *this,vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *vt)

{
  BinaryReader *in_RDI;
  vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *unaff_retaddr;
  vec3i *in_stack_00000008;
  uint64_t length;
  unsigned_long *in_stack_ffffffffffffffd8;
  
  read<unsigned_long,void>(in_RDI,in_stack_ffffffffffffffd8);
  std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::resize
            (unaff_retaddr,(size_type)in_RDI);
  std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::data
            ((vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *)0x12c5bb);
  copyBytes<pbrt::math::vec3i>((BinaryReader *)length,in_stack_00000008,(size_t)unaff_retaddr);
  return;
}

Assistant:

inline void read(std::vector<T, A> &vt)
    {
      uint64_t length;
      read(length);
      vt.resize(length);
      copyBytes(vt.data(), length*sizeof(T));
    }